

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_deflate.cpp
# Opt level: O2

void __thiscall ktx::CommandDeflate::executeDeflate(CommandDeflate *this)

{
  Reporter *report;
  OptionsSingleInSingleOut *filepath;
  ktxSupercmpScheme kVar1;
  size_type sVar2;
  istream *stream;
  bool bVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  char *in_RCX;
  undefined1 extraout_DL;
  ktxSupercmpScheme extraout_EDX;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 testrun;
  ktxSupercmpScheme extraout_EDX_00;
  ktxSupercmpScheme scheme;
  string *filepath_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  uint uVar8;
  ulong __sub;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view filepath_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  KTXTexture2 texture;
  OutputStream outputFile;
  string newScParams;
  path outputPath;
  string writerScParams;
  anon_class_8_1_2ed807fb updateMetadataValue;
  char *local_478;
  size_type local_470;
  char local_468 [8];
  undefined8 uStack_460;
  KTXTexture2 *local_458;
  string origWriterName;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*> ktx2Stream;
  string local_408 [32];
  InputStream inputStream;
  
  filepath = &(this->options).super_OptionsSingleInSingleOut;
  report = &(this->super_Command).super_Reporter;
  InputStream::InputStream(&inputStream,&filepath->inputFilepath,report);
  stream = inputStream.activeStream;
  filepath_01._M_str = in_RCX;
  filepath_01._M_len =
       (size_t)(this->options).super_OptionsSingleInSingleOut.inputFilepath._M_dataplus._M_p;
  fmtInFile_abi_cxx11_
            (&outputPath._M_pathname,
             (ktx *)(this->options).super_OptionsSingleInSingleOut.inputFilepath._M_string_length,
             filepath_01);
  validateToolInput(stream,&outputPath._M_pathname,report);
  std::__cxx11::string::~string((string *)&outputPath);
  texture.handle_ = (ktxTexture2 *)0x0;
  StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::StreambufStream
            (&ktx2Stream,
             *(basic_streambuf<char,_std::char_traits<char>_> **)
              (inputStream.activeStream +
              *(long *)(*(long *)inputStream.activeStream + -0x18) + 0xe8),_S_in|_S_bin);
  iVar5 = ktxTexture2_CreateFromStream
                    (ktx2Stream._stream._M_t.
                     super___uniq_ptr_impl<ktxStream,_std::default_delete<ktxStream>_>._M_t.
                     super__Tuple_impl<0UL,_ktxStream_*,_std::default_delete<ktxStream>_>.
                     super__Head_base<0UL,_ktxStream_*,_false>._M_head_impl,1,&texture);
  scheme = extraout_EDX;
  if (iVar5 != 0) {
    outputPath._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar5);
    Reporter::fatal<char_const(&)[34],char_const*>
              (report,INVALID_FILE,(char (*) [34])"Failed to create KTX2 texture: {}",
               (char **)&outputPath);
    scheme = extraout_EDX_00;
  }
  kVar1 = (texture.handle_)->supercompressionScheme;
  if (kVar1 != KTX_SS_BEGIN_RANGE) {
    if ((kVar1 & ~KTX_SS_BASIS_LZ) == KTX_SS_ZSTD) {
      if ((this->options).super_Options.quiet != false) goto LAB_0016c612;
      toString_abi_cxx11_(&outputPath._M_pathname,(ktx *)(ulong)kVar1,scheme);
      Reporter::warning<char_const(&)[46],std::__cxx11::string,std::__cxx11::string&>
                (report,(char (*) [46])"Modifying existing {} supercompression of {}.",
                 &outputPath._M_pathname,&filepath->inputFilepath);
    }
    else {
      toString_abi_cxx11_(&outputPath._M_pathname,(ktx *)(ulong)kVar1,scheme);
      Reporter::fatal<char_const(&)[60],std::__cxx11::string>
                (report,INVALID_FILE,
                 (char (*) [60])"Cannot further deflate a KTX2 file supercompressed with {}.",
                 &outputPath._M_pathname);
    }
    std::__cxx11::string::~string((string *)&outputPath);
  }
LAB_0016c612:
  if ((this->options).super_OptionsDeflate.zstd.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar5 = ktxTexture2_DeflateZstd
                      (texture.handle_,
                       (this->options).super_OptionsDeflate.zstd.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    if (iVar5 != 0) {
      outputPath._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar5);
      Reporter::fatal<char_const(&)[37],char_const*>
                (report,IO_FAILURE,(char (*) [37])"Zstd deflation failed. KTX Error: {}",
                 (char **)&outputPath);
    }
  }
  if ((this->options).super_OptionsDeflate.zlib.super__Optional_base<unsigned_int,_true,_true>.
      _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    iVar5 = ktxTexture2_DeflateZLIB
                      (texture.handle_,
                       (this->options).super_OptionsDeflate.zlib.
                       super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    if (iVar5 != 0) {
      outputPath._M_pathname._M_dataplus._M_p = (pointer)ktxErrorString(iVar5);
      Reporter::fatal<char_const(&)[37],char_const*>
                (report,IO_FAILURE,(char (*) [37])"ZLIB deflation failed. KTX Error: {}",
                 (char **)&outputPath);
    }
  }
  writerScParams._M_dataplus._M_p = (pointer)&writerScParams.field_2;
  writerScParams._M_string_length = 0;
  writerScParams.field_2._M_local_buf[0] = '\0';
  origWriterName._M_dataplus._M_p = (pointer)&origWriterName.field_2;
  origWriterName._M_string_length = 0;
  origWriterName.field_2._M_local_buf[0] = '\0';
  updateMetadataValue.texture = &texture;
  local_458 = &texture;
  executeDeflate()::$_0::operator()[abi_cxx11_
            (&outputPath._M_pathname,&local_458,"KTXwriterScParams");
  std::__cxx11::string::operator=((string *)&writerScParams,(string *)&outputPath);
  std::__cxx11::string::~string((string *)&outputPath);
  testrun = extraout_DL;
  if (writerScParams._M_string_length != 0) {
    executeDeflate()::$_0::operator()[abi_cxx11_(&outputPath._M_pathname,&local_458,"KTXwriter");
    if (outputPath._M_pathname._M_string_length != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile,
                 "ktx (?:create|deflate|encode|transcode)",0x10);
      newScParams.field_2._M_allocated_capacity = 0;
      newScParams.field_2._8_8_ = 0;
      newScParams._M_dataplus._M_p = (pointer)0x0;
      newScParams._M_string_length = 0;
      bVar3 = std::
              regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        (&outputPath._M_pathname,
                         (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile,0);
      if (bVar3) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile,
                   " ?--(?:zlib|zstd) [1-9][0-9]?");
        std::
        regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                  (&writerScParams,
                   (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)&newScParams,
                   (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile,0);
      }
      else {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile,"ktxsc|toktx"
                  );
        bVar3 = std::
                regex_search<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          (&outputPath._M_pathname,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile,0);
        if (bVar3) {
          std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::operator=
                    ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile,
                     " ?--zcmp ?[1-9]?[0-9]?");
          std::
          regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (&writerScParams,
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&newScParams,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile,0);
        }
        std::__cxx11::string::find((char)&outputPath,0x20);
        std::__cxx11::string::substr((ulong)local_408,(ulong)&outputPath);
        std::__cxx11::string::operator=((string *)&origWriterName,local_408);
        std::__cxx11::string::~string(local_408);
      }
      uVar8 = 0;
      while( true ) {
        sVar2 = origWriterName._M_string_length;
        if ((newScParams._M_dataplus._M_p == (pointer)newScParams._M_string_length) ||
           (__sub = (ulong)uVar8,
           (long)(newScParams._M_string_length - (long)newScParams._M_dataplus._M_p) / 0x18 - 3U <=
           __sub)) break;
        uVar6 = std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::position((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&newScParams,__sub);
        pcVar7 = (char *)std::__cxx11::
                         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::length((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)&newScParams,__sub);
        std::__cxx11::string::replace((ulong)&writerScParams,uVar6,pcVar7);
        uVar8 = uVar8 + 1;
      }
      if (writerScParams._M_string_length != 0) {
        std::
        _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&newScParams);
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                  ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile);
        std::__cxx11::string::~string((string *)&outputPath);
        testrun = extraout_DL_00;
        if (sVar2 == 0) {
          bVar3 = false;
          goto LAB_0016c966;
        }
        goto LAB_0016c8f2;
      }
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&newScParams);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&outputFile);
    }
    std::__cxx11::string::~string((string *)&outputPath);
    testrun = extraout_DL_01;
  }
LAB_0016c8f2:
  version_abi_cxx11_(&newScParams,(ktx *)(ulong)(this->options).super_OptionsGeneric.testrun,
                     (bool)testrun);
  outputPath._M_pathname._M_dataplus._M_p =
       (this->super_Command).super_Reporter.commandName._M_dataplus._M_p;
  outputPath._M_pathname._M_string_length =
       (this->super_Command).super_Reporter.commandName._M_string_length;
  outputPath._M_pathname.field_2._M_allocated_capacity = (size_type)newScParams._M_dataplus._M_p;
  outputPath._M_pathname.field_2._8_8_ = newScParams._M_string_length;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&outputPath;
  fmt.size_ = 0xdd;
  fmt.data_ = (char *)0x5;
  ::fmt::v10::vformat_abi_cxx11_(&outputFile.filepath,(v10 *)0x1d8e91,fmt,args);
  std::__cxx11::string::~string((string *)&newScParams);
  executeDeflate::anon_class_8_1_2ed807fb::operator()
            (&updateMetadataValue,"KTXwriter",&outputFile.filepath);
  std::__cxx11::string::~string((string *)&outputFile);
  bVar3 = true;
LAB_0016c966:
  outputPath._M_pathname._M_dataplus._M_p =
       (this->options).super_OptionsDeflate.compressOptions._M_dataplus._M_p;
  outputPath._M_pathname._M_string_length =
       (this->options).super_OptionsDeflate.compressOptions._M_string_length;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)&outputPath;
  fmt_00.size_ = 0xd;
  fmt_00.data_ = (char *)0x2;
  ::fmt::v10::vformat_abi_cxx11_(&newScParams,(v10 *)0x1dcb84,fmt_00,args_00);
  if (*newScParams._M_dataplus._M_p == ' ') {
    if (writerScParams._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&writerScParams);
      std::__cxx11::string::erase(&writerScParams,writerScParams._M_dataplus._M_p);
    }
    else if (bVar3) {
      std::__cxx11::string::erase(&newScParams);
      outputPath._M_pathname._M_dataplus = newScParams._M_dataplus;
      outputPath._M_pathname._M_string_length = newScParams._M_string_length;
      outputPath._M_pathname.field_2._M_allocated_capacity =
           (size_type)origWriterName._M_dataplus._M_p;
      outputPath._M_pathname.field_2._8_8_ = origWriterName._M_string_length;
      outputPath._32_8_ = writerScParams._M_dataplus._M_p;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&outputPath;
      fmt_01.size_ = 0xddd;
      fmt_01.data_ = (char *)0x11;
      ::fmt::v10::vformat_abi_cxx11_(&outputFile.filepath,(v10 *)"{} / (from {}) {}",fmt_01,args_01)
      ;
      std::__cxx11::string::operator=((string *)&writerScParams,(string *)&outputFile);
      std::__cxx11::string::~string((string *)&outputFile);
    }
    else {
      std::__cxx11::string::append((string *)&writerScParams);
    }
    executeDeflate::anon_class_8_1_2ed807fb::operator()
              (&updateMetadataValue,"KTXwriterScParams",&writerScParams);
    filepath_00 = &(this->options).super_OptionsSingleInSingleOut.outputFilepath;
    std::__cxx11::string::string((string *)&local_478,(string *)filepath_00);
    outputFile.filepath._M_dataplus._M_p = (pointer)&outputFile.filepath.field_2;
    if (local_478 == local_468) {
      outputFile.filepath.field_2._8_8_ = uStack_460;
    }
    else {
      outputFile.filepath._M_dataplus._M_p = local_478;
    }
    outputFile.filepath._M_string_length = local_470;
    local_470 = 0;
    local_468[0] = '\0';
    local_478 = local_468;
    std::filesystem::__cxx11::path::path(&outputPath,&outputFile.filepath,auto_format);
    std::__cxx11::string::~string((string *)&outputFile);
    std::__cxx11::string::~string((string *)&local_478);
    cVar4 = std::filesystem::__cxx11::path::has_parent_path();
    if (cVar4 != '\0') {
      std::filesystem::__cxx11::path::parent_path();
      std::filesystem::create_directories((path *)&outputFile);
      std::filesystem::__cxx11::path::~path((path *)&outputFile);
    }
    OutputStream::OutputStream(&outputFile,filepath_00,report);
    OutputStream::writeKTX2(&outputFile,(ktxTexture *)texture.handle_,report);
    OutputStream::~OutputStream(&outputFile);
    std::filesystem::__cxx11::path::~path(&outputPath);
    std::__cxx11::string::~string((string *)&newScParams);
    std::__cxx11::string::~string((string *)&origWriterName);
    std::__cxx11::string::~string((string *)&writerScParams);
    StreambufStream<std::basic_streambuf<char,_std::char_traits<char>_>_*>::~StreambufStream
              (&ktx2Stream);
    KTXTexture2::~KTXTexture2(&texture);
    InputStream::~InputStream(&inputStream);
    return;
  }
  __assert_fail("newScParams[0] == \' \'",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_deflate.cpp"
                ,0x123,"void ktx::CommandDeflate::executeDeflate()");
}

Assistant:

void CommandDeflate::executeDeflate() {
    InputStream inputStream(options.inputFilepath, *this);
    validateToolInput(inputStream, fmtInFile(options.inputFilepath), *this);

    KTXTexture2 texture{nullptr};
    StreambufStream<std::streambuf*> ktx2Stream{inputStream->rdbuf(), std::ios::in | std::ios::binary};
    auto ret = ktxTexture2_CreateFromStream(ktx2Stream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, texture.pHandle());
    if (ret != KTX_SUCCESS)
        fatal(rc::INVALID_FILE, "Failed to create KTX2 texture: {}", ktxErrorString(ret));

    if (texture->supercompressionScheme != KTX_SS_NONE) {
        switch (texture->supercompressionScheme) {
          case KTX_SS_ZLIB:
          case KTX_SS_ZSTD:
            if (!options.quiet) {
                warning("Modifying existing {} supercompression of {}.",
                        toString(texture->supercompressionScheme),
                        options.inputFilepath);
            }
            break;
          default:
            fatal(rc::INVALID_FILE,
                  "Cannot further deflate a KTX2 file supercompressed with {}.",
                  toString(texture->supercompressionScheme));
        }
    }

    if (options.zstd) {
        ret = ktxTexture2_DeflateZstd(texture, *options.zstd);
        if (ret != KTX_SUCCESS)
            fatal(rc::IO_FAILURE, "Zstd deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    if (options.zlib) {
        ret = ktxTexture2_DeflateZLIB(texture, *options.zlib);
        if (ret != KTX_SUCCESS)
            fatal(rc::IO_FAILURE, "ZLIB deflation failed. KTX Error: {}", ktxErrorString(ret));
    }

    const auto& findMetadataValue = [&](const char* const key) {
        const char* value;
        uint32_t valueLen;
        std::string result;
        auto ret = ktxHashList_FindValue(&texture->kvDataHead, key,
                      &valueLen, (void**)&value);
        if (ret == KTX_SUCCESS) {
            // The values we are looking for are required to be NUL terminated.
            result.assign(value, valueLen - 1);
        }
        return result;
    };

    const auto updateMetadataValue = [&](const char* const key,
                                 const std::string& value) {
        ktxHashList_DeleteKVPair(&texture->kvDataHead, key);
        ktxHashList_AddKVPair(&texture->kvDataHead, key,
                static_cast<uint32_t>(value.size() + 1), // +1 to include \0
                value.c_str());
    };

    // ======= KTXwriter and KTXwriterScParams metadata handling =======
    //
    // In order to preserve encoding parameters applied to the data with
    // other apps prior to this deflate operation, `deflate` does the
    // following if KTXwriterScParams data exists in the input file:
    //
    // 1. If the writer was one of the ktx suite (i.e. create or encode)
    //    and KTXwriterScParams contains non-deflate options, use the
    //    original KTXwriter. Replace an existing deflate option with
    //    that currently specified or append it as new.
    //
    //    The original writer will obviously understand its own
    //    non-deflate options and, since it is part of the ktx suite
    //    it will understand the updated or new deflate option that will
    //    be added.
    //
    //    Cheeky! Spec. for KTXwriter says "only the most recent writer
    //    Should be identified." For KTXwriterScParams it says the writer
    //    should "append the (new) options" when "building on operations
    //    done previously." To somewhat resolve the conflict it changes
    //    the previous "only" to "in general."
    //
    // 2. If the writer was another tool, preserve its options in
    //    KTWwriterScParams labelled with its name and append the
    //    currently specified deflate option like so
    //
    //        --zstd 18 | (from <name>) option1 option2 ...
    //
    //    where <name> is the first word of the original KTXwriter metadata,
    //    e.g, "tokt". Rewrite KTXwriter with the name of this tool.
    //
    // 3. If the writer was ktxsc or toktx remove any original deflate
    //    option from the preserved parameters as we know those option
    //    names.

    bool changeWriter = true;
    std::string writerScParams;
    std::string origWriterName;
    writerScParams = findMetadataValue(KTX_WRITER_SCPARAMS_KEY);
    if (!writerScParams.empty()) {
        std::string writer = findMetadataValue(KTX_WRITER_KEY);
        if (!writer.empty()) {
            std::regex e("ktx (?:create|deflate|encode|transcode)");
            std::smatch deflateOptionMatch;
            if (std::regex_search(writer, e)) {
                // Writer is member of the ktx suite.
                // Look for existing deflate option
                e = " ?--(?:zlib|zstd) [1-9][0-9]?";
                (void)std::regex_search(writerScParams, deflateOptionMatch, e);
            } else {
                // Writer is not a member of the ktx suite
                e = "ktxsc|toktx";
                if (std::regex_search(writer, e)) {
                    // Look for toktx/ktxsc deflate option
                    e = " ?--zcmp ?[1-9]?[0-9]?";
                    (void)std::regex_search(writerScParams,
                                            deflateOptionMatch, e);
                }
                origWriterName = writer.substr(0, writer.find_first_of(' '));
            }
            // Remove existing deflate option since its value will not apply
            // to the newly deflated data.
            for (uint32_t i = 0; i < deflateOptionMatch.size(); i++) {
                 writerScParams.replace(deflateOptionMatch.position(i),
                                        deflateOptionMatch.length(i),
                                        "");
            }
            // Does ScParams still have data and is the original writer a
            // member of the ktx suite?
            if (!writerScParams.empty() && origWriterName.empty()) {
                changeWriter = false;
            }
        }
    }

    if (changeWriter) {
        // Create or modify KTXwriter metadata.
        const auto writer = fmt::format("{} {}", commandName, version(options.testrun));
        updateMetadataValue(KTX_WRITER_KEY, writer);
    }

    // Format new writerScParams.
    auto newScParams = fmt::format("{}", options.compressOptions);
    // Options always contain a leading space
    assert(newScParams[0] == ' ');
    if (!writerScParams.empty()) {
        if (changeWriter) {
            // Leading space unneeded as this param will be first.
            newScParams.erase(newScParams.begin());
            writerScParams = fmt::format("{} / (from {}) {}", newScParams,
                                         origWriterName, writerScParams);
        } else {
            writerScParams.append(newScParams);
        }
    } else {
        writerScParams = newScParams;
        writerScParams.erase(writerScParams.begin()); // Erase leading space.
    }

    // Add KTXwriterScParams metadata
    updateMetadataValue(KTX_WRITER_SCPARAMS_KEY, writerScParams);

    // Save output file
    const auto outputPath = std::filesystem::path(DecodeUTF8Path(options.outputFilepath));
    if (outputPath.has_parent_path())
        std::filesystem::create_directories(outputPath.parent_path());

    OutputStream outputFile(options.outputFilepath, *this);
    outputFile.writeKTX2(texture, *this);
}